

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_significand<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int,fmt::v8::detail::digit_grouping<char16_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,uint significand,
          int significand_size,int exponent,digit_grouping<char16_t> *grouping)

{
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar1;
  format_decimal_result<char_*> fVar2;
  format_decimal_result<char16_t_*> fVar3;
  char buffer_1 [10];
  char16_t buffer [10];
  char local_242 [10];
  undefined **local_238;
  char *local_230;
  size_t sStack_228;
  ulong local_220;
  char local_218 [504];
  
  if ((grouping->sep_).thousands_sep == L'\0') {
    fVar3 = format_decimal<char16_t,unsigned_int>
                      ((char16_t *)&local_238,significand,significand_size);
    bVar1 = copy_str_noinline<char16_t,char16_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                      ((char16_t *)&local_238,fVar3.end,out);
    local_238 = (undefined **)CONCAT62(local_238._2_6_,0x30);
    bVar1 = fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,char16_t>
                      (bVar1,exponent,(char16_t *)&local_238);
  }
  else {
    sStack_228 = 0;
    local_238 = &PTR_grow_001b2930;
    local_220 = 500;
    local_230 = local_218;
    fVar2 = format_decimal<char,unsigned_int>(local_242,significand,significand_size);
    copy_str_noinline<char,char*,fmt::v8::appender>(local_242,fVar2.end,(appender)&local_238);
    local_242[0] = '0';
    fill_n<fmt::v8::appender,int,char>((appender)&local_238,exponent,local_242);
    digits.size_ = sStack_228;
    digits.data_ = local_230;
    bVar1 = digit_grouping<char16_t>::
            apply<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char>
                      (grouping,out,digits);
    if (local_230 != local_218) {
      operator_delete(local_230,local_220);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}